

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmimage.cpp
# Opt level: O2

void __thiscall CVmImageLoader::load_ext_resfiles(CVmImageLoader *this)

{
  err_frame_t *peVar1;
  CVmException *pCVar2;
  char cVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  char *filename;
  CVmFile *this_00;
  undefined8 *puVar5;
  long *plVar6;
  int iVar7;
  char suffix_uc [4];
  char suffix_lc [4];
  CVmImageLoader *loader;
  CVmImageFile *imagefp;
  CVmImageLoaderMres_std res_ifc;
  err_frame_t err_cur__;
  char resfile [4096];
  
  builtin_strncpy(suffix_lc,"3r0",4);
  builtin_strncpy(suffix_uc,"3R0",4);
  for (iVar7 = -10; iVar7 != 0; iVar7 = iVar7 + 1) {
    cVar3 = (char)iVar7 + ':';
    suffix_uc[2] = cVar3;
    suffix_lc[2] = cVar3;
    iVar4 = (*G_host_ifc_X->_vptr_CVmHostIfc[0xf])();
    if (CONCAT44(extraout_var,iVar4) == 0) {
      strcpy(resfile,this->fname_);
    }
    else {
      iVar4 = (*G_host_ifc_X->_vptr_CVmHostIfc[0xf])();
      filename = os_get_root_name(this->fname_);
      os_build_full_path(resfile,0x1000,(char *)CONCAT44(extraout_var_00,iVar4),filename);
    }
    os_remext(resfile);
    os_addext(resfile,suffix_lc);
    iVar4 = access(resfile,0);
    if (iVar4 != 0) {
      os_remext(resfile);
      os_addext(resfile,suffix_uc);
    }
    iVar4 = access(resfile,0);
    if (iVar4 == 0) {
      imagefp = (CVmImageFile *)0x0;
      loader = (CVmImageLoader *)0x0;
      iVar4 = (*G_host_ifc_X->_vptr_CVmHostIfc[10])(G_host_ifc_X,resfile);
      this_00 = (CVmFile *)operator_new(0x10);
      this_00->fp_ = (osfildef *)0x0;
      this_00->seek_base_ = 0;
      puVar5 = (undefined8 *)_ZTW11G_err_frame();
      err_cur__.prv_ = (err_frame_t *)*puVar5;
      plVar6 = (long *)_ZTW11G_err_frame();
      *plVar6 = (long)&err_cur__;
      err_cur__.state_ = _setjmp((__jmp_buf_tag *)err_cur__.jmpbuf_);
      if (err_cur__.state_ == 0) {
        res_ifc.super_CVmImageLoaderMres._vptr_CVmImageLoaderMres =
             (_func_int **)&PTR__CVmImageLoaderMres_0035f5f0;
        res_ifc.hostifc_ = G_host_ifc_X;
        res_ifc.fileno_ = iVar4;
        CVmFile::open_read(this_00,resfile,0xc);
        imagefp = (CVmImageFile *)operator_new(0x20);
        imagefp->_vptr_CVmImageFile = (_func_int **)&PTR__CVmImageFileExt_0035f3f8;
        imagefp[1]._vptr_CVmImageFile = (_func_int **)this_00;
        imagefp[2]._vptr_CVmImageFile = (_func_int **)0x0;
        imagefp[3]._vptr_CVmImageFile = (_func_int **)0x0;
        loader = (CVmImageLoader *)operator_new(0x98);
        CVmImageLoader(loader,imagefp,resfile,0);
        load_resource_file(loader,&res_ifc.super_CVmImageLoaderMres);
      }
      if (-1 < (short)err_cur__.state_) {
        err_cur__.state_ = err_cur__.state_ | 0x8000;
        if (loader != (CVmImageLoader *)0x0) {
          if (loader != (CVmImageLoader *)0x0) {
            ~CVmImageLoader(loader);
          }
          operator_delete(loader,0x98);
        }
        if ((imagefp != (CVmImageFile *)0x0) && (imagefp != (CVmImageFile *)0x0)) {
          (*imagefp->_vptr_CVmImageFile[1])();
        }
        CVmFile::~CVmFile(this_00);
        operator_delete(this_00,0x10);
      }
      peVar1 = err_cur__.prv_;
      puVar5 = (undefined8 *)_ZTW11G_err_frame();
      *puVar5 = peVar1;
      if ((err_cur__.state_ & 0x4001U) != 0) {
        puVar5 = (undefined8 *)_ZTW11G_err_frame();
        if ((*(byte *)*puVar5 & 2) != 0) {
          plVar6 = (long *)_ZTW11G_err_frame();
          free(*(void **)(*plVar6 + 0x10));
        }
        pCVar2 = err_cur__.exc_;
        plVar6 = (long *)_ZTW11G_err_frame();
        *(CVmException **)(*plVar6 + 0x10) = pCVar2;
        err_rethrow();
      }
      if ((err_cur__.state_ & 2U) != 0) {
        free(err_cur__.exc_);
      }
    }
  }
  return;
}

Assistant:

void CVmImageLoader::load_ext_resfiles(VMG0_)
{
    int i;
    char suffix_lc[4];
    char suffix_uc[4];

    /* set up the templates for the resource file suffix */
    strcpy(suffix_lc, "3r0");
    strcpy(suffix_uc, "3R0");
    
    /* 
     *   Search for resource files with the same name as the image file, but
     *   with the extension replaced with .3r0 through .3r9.  Try both
     *   lower-case and upper-case names (in that order), in case the file
     *   system is case-sensitive.  
     */
    for (i = 0 ; i < 10 ; ++i)
    {
        char resfile[OSFNMAX];
        
        /* substitute the current suffix number */
        suffix_lc[2] = suffix_uc[2] = i + '0';

        /* 
         *   if there's an explicit resource path, use it, otherwise use
         *   the same directory that contains the image file 
         */
        if (G_host_ifc->get_res_path() != 0)
        {
            /* 
             *   there's an explicit resource path - build the full path to
             *   the resource file using the resource path and the root name
             *   of the image file 
             */
            os_build_full_path(resfile, sizeof(resfile),
                               G_host_ifc->get_res_path(),
                               os_get_root_name(fname_));
        }
        else
        {
            /* 
             *   there's no resoruce path - use the image file full name,
             *   including any directory path information 
             */
            strcpy(resfile, fname_);
        }

        /* replace the old image file extension with the resource suffix */
        os_remext(resfile);
        os_addext(resfile, suffix_lc);

        /* if this file doesn't exist, try the upper-case name */
        if (osfacc(resfile))
        {
            /* replace the suffix with the upper-case version */
            os_remext(resfile);
            os_addext(resfile, suffix_uc);
        }

        /* check to see if this file exists */
        if (!osfacc(resfile))
        {
            int fileno;
            CVmFile *fp;
            CVmImageFile *volatile imagefp = 0;
            CVmImageLoader *volatile loader = 0;
            
            /* ask the host system to assign a file number */
            fileno = G_host_ifc->add_resfile(resfile);

            /* create a file object for reading the file */
            fp = new CVmFile();

            err_try
            {
                CVmImageLoaderMres_std res_ifc(fileno, G_host_ifc);

                /* open the file */
                fp->open_read(resfile, OSFTT3IMG);

                /* set up the loader */
                imagefp = new CVmImageFileExt(fp);
                loader = new CVmImageLoader(imagefp, resfile, 0);

                /* load the resource-only file */
                loader->load_resource_file(&res_ifc);
            }
            err_finally
            {
                /* delete the objects we created */
                if (loader != 0)
                    delete loader;
                if (imagefp != 0)
                    delete imagefp;
                delete fp;
            }
            err_end;
        }